

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pop3.c
# Opt level: O3

CURLcode pop3_statemach_act(connectdata *conn)

{
  byte *pbVar1;
  uint *puVar2;
  curl_socket_t sockfd;
  curl_usessl cVar3;
  int *piVar4;
  _Bool _Var5;
  CURLcode CVar6;
  imapstate iVar7;
  CURLcode CVar8;
  uint uVar9;
  size_t sVar10;
  char *__dest;
  char *pcVar11;
  anon_union_224_10_26c073a1_for_proto *pp;
  SessionHandle *pSVar12;
  size_t sVar13;
  size_t sVar14;
  size_t maxlen;
  pop3_conn *pop3c;
  int pop3code;
  size_t nread;
  saslprogress local_50;
  undefined4 uStack_4c;
  uint local_44;
  SASL *local_40;
  size_t local_38;
  
  sockfd = conn->sock[0];
  local_38 = 0;
  if ((conn->proto).imapc.state == IMAP_UPGRADETLS) {
LAB_0057bed8:
    CVar6 = CURLE_NOT_BUILT_IN;
  }
  else {
    pp = &conn->proto;
    if ((conn->proto).ftpc.pp.sendleft != 0) {
      CVar6 = Curl_pp_flushsend(&(pp->ftpc).pp);
      return CVar6;
    }
    local_40 = (SASL *)&(conn->proto).imapc.sasl.prefmech;
    do {
      CVar6 = Curl_pp_readresp(sockfd,&(pp->ftpc).pp,(int *)&local_44,&local_38);
      uVar9 = local_44;
      if (CVar6 != CURLE_OK) {
        return CVar6;
      }
      if (local_44 == 0) {
        return CURLE_OK;
      }
      switch((conn->proto).imapc.state) {
      case IMAP_SERVERGREET:
        pSVar12 = conn->data;
        sVar10 = strlen((pSVar12->state).buffer);
        if (uVar9 != 0x2b) {
          Curl_failf(pSVar12,"Got unexpected pop3-server response");
          return CURLE_FTP_WEIRD_SERVER_REPLY;
        }
        if (((3 < sVar10) && (3 < sVar10 - 2)) && ((pSVar12->state).buffer[sVar10 - 2] == '>')) {
          pcVar11 = (pSVar12->state).buffer + 3;
          do {
            if (*pcVar11 == '<') {
              if (sVar10 != 4) {
                __dest = (char *)(*Curl_ccalloc)(1,sVar10 - 3);
                (conn->proto).imapc.mailbox_uidvalidity = __dest;
                if (__dest != (char *)0x0) {
                  memcpy(__dest,pcVar11,sVar10 - 4);
                  (conn->proto).imapc.mailbox_uidvalidity[sVar10 - 4] = '\0';
                  pbVar1 = (byte *)((long)&conn->proto + 0xa8);
                  *pbVar1 = *pbVar1 | 2;
                }
              }
              break;
            }
            pcVar11 = pcVar11 + 1;
            sVar10 = sVar10 - 1;
          } while (sVar10 != 5);
        }
        *(undefined4 *)((long)&conn->proto + 0x94) = 0;
        (conn->proto).imapc.cmdid = 0;
        (conn->proto).pop3c.tls_supported = false;
        CVar6 = Curl_pp_sendf(&(pp->ftpc).pp,"%s","CAPA");
        iVar7 = IMAP_CAPABILITY;
        goto joined_r0x0057c042;
      case IMAP_CAPABILITY:
        pSVar12 = conn->data;
        pcVar11 = (pSVar12->state).buffer;
        sVar10 = strlen(pcVar11);
        if (uVar9 == 0x2b) {
          cVar3 = (pSVar12->set).use_ssl;
          if ((cVar3 == CURLUSESSL_NONE) || (conn->ssl[0].use != false)) goto LAB_0057c298;
          if ((conn->proto).pop3c.tls_supported != true) {
            if (cVar3 != CURLUSESSL_TRY) {
              Curl_failf(pSVar12,"STLS not supported.");
              return CURLE_USE_SSL_FAILED;
            }
            CVar8 = pop3_perform_authentication(conn);
            break;
          }
          CVar6 = Curl_pp_sendf(&(pp->ftpc).pp,"%s","STLS");
          iVar7 = IMAP_STARTTLS;
          goto joined_r0x0057c042;
        }
        if (uVar9 != 0x2a) {
          pbVar1 = (byte *)((long)&conn->proto + 0xa8);
          *pbVar1 = *pbVar1 | 1;
          goto LAB_0057c298;
        }
        if (3 < sVar10) {
          if (*(int *)pcVar11 == 0x534c5453) {
            (conn->proto).pop3c.tls_supported = true;
          }
          else if (*(int *)pcVar11 == 0x52455355) {
            pbVar1 = (byte *)((long)&conn->proto + 0xa8);
            *pbVar1 = *pbVar1 | 1;
          }
          else if ((sVar10 != 4) &&
                  ((pSVar12->state).buffer[4] == ' ' && *(int *)pcVar11 == 0x4c534153)) {
            pbVar1 = (byte *)((long)&conn->proto + 0xa8);
            *pbVar1 = *pbVar1 | 4;
            sVar13 = sVar10 - 5;
            if (sVar13 != 0) {
              pcVar11 = (pSVar12->state).buffer + 5;
              do {
                while ((0x20 < (ulong)(byte)*pcVar11 ||
                       ((0x100002600U >> ((ulong)(byte)*pcVar11 & 0x3f) & 1) == 0))) {
                  sVar14 = 0;
                  do {
                    if (((ulong)(byte)pcVar11[sVar14] < 0x21) &&
                       (maxlen = sVar14,
                       (0x100002600U >> ((ulong)(byte)pcVar11[sVar14] & 0x3f) & 1) != 0)) break;
                    sVar14 = sVar14 + 1;
                    maxlen = sVar13;
                  } while (sVar13 != sVar14);
                  uVar9 = Curl_sasl_decode_mech(pcVar11,maxlen,(size_t *)&local_50);
                  if ((uVar9 != 0) && (CONCAT44(uStack_4c,local_50) == maxlen)) {
                    puVar2 = (uint *)((long)&conn->proto + 0x94);
                    *puVar2 = *puVar2 | uVar9;
                  }
                  pcVar11 = pcVar11 + maxlen;
                  sVar13 = sVar13 - maxlen;
                  if (sVar13 == 0) goto LAB_0057c2af;
                }
                pcVar11 = pcVar11 + 1;
                sVar13 = sVar13 - 1;
              } while (sVar13 != 0);
            }
          }
        }
        goto LAB_0057c2af;
      case IMAP_STARTTLS:
        if (local_44 == 0x2b) goto LAB_0057bed8;
        if ((conn->data->set).use_ssl != CURLUSESSL_TRY) {
          Curl_failf(conn->data,"STARTTLS denied. %c",(ulong)local_44);
          return CURLE_USE_SSL_FAILED;
        }
LAB_0057c298:
        CVar8 = pop3_perform_authentication(conn);
        break;
      default:
switchD_0057bf7a_caseD_4:
        (conn->proto).imapc.state = IMAP_STOP;
        return CURLE_OK;
      case IMAP_AUTHENTICATE:
        pSVar12 = conn->data;
        CVar8 = Curl_sasl_continue(local_40,conn,local_44,&local_50);
        if (CVar8 == CURLE_OK) {
          if (local_50 == SASL_IDLE) {
            uVar9 = (conn->proto).pop3c.preftype & (conn->proto).pop3c.authtypes;
            if ((uVar9 & 2) == 0) {
              if ((uVar9 & 1) == 0) {
                Curl_failf(pSVar12,"Authentication cancelled");
                CVar8 = CURLE_LOGIN_DENIED;
              }
              else {
                CVar8 = pop3_perform_user(conn);
              }
            }
            else {
              CVar8 = pop3_perform_apop(conn);
            }
          }
          else {
            CVar8 = CURLE_OK;
            CVar6 = CURLE_OK;
            if (local_50 == SASL_DONE) goto LAB_0057c237;
          }
        }
        break;
      case IMAP_LOGIN:
        if (local_44 == 0x2b) goto switchD_0057bf7a_caseD_4;
        pSVar12 = conn->data;
        pcVar11 = "Authentication failed: %d";
        goto LAB_0057c461;
      case IMAP_LIST:
        if (local_44 != 0x2b) goto LAB_0057c3fb;
        pcVar11 = conn->passwd;
        if (pcVar11 == (char *)0x0) {
          pcVar11 = "";
        }
        CVar6 = Curl_pp_sendf(&(pp->ftpc).pp,"PASS %s",pcVar11);
        iVar7 = IMAP_SELECT;
joined_r0x0057c042:
        if (CVar6 != CURLE_OK) {
          return CVar6;
        }
        (conn->proto).imapc.state = iVar7;
        goto LAB_0057c38d;
      case IMAP_SELECT:
        if (local_44 == 0x2b) goto switchD_0057bf7a_caseD_4;
LAB_0057c3fb:
        pSVar12 = conn->data;
        pcVar11 = "Access denied. %c";
LAB_0057c461:
        Curl_failf(pSVar12,pcVar11,(ulong)local_44);
        return CURLE_LOGIN_DENIED;
      case IMAP_FETCH:
        CVar6 = CURLE_RECV_ERROR;
        if (local_44 == 0x2b) {
          pSVar12 = conn->data;
          piVar4 = (int *)(pSVar12->req).protop;
          (conn->proto).pop3c.eob = 2;
          (conn->proto).pop3c.strip = 2;
          CVar6 = CURLE_OK;
          if (*piVar4 == 0) {
            Curl_setup_transfer(conn,0,-1,false,(curl_off_t *)0x0,-1,(curl_off_t *)0x0);
            pcVar11 = (conn->proto).ftpc.pp.cache;
            CVar6 = CURLE_OK;
            if (pcVar11 != (char *)0x0) {
              if ((pSVar12->set).opt_no_body == false) {
                CVar8 = Curl_pop3_write(conn,pcVar11,(conn->proto).rtspc.rtp_bufsize);
                if (CVar8 != CURLE_OK) {
                  return CVar8;
                }
                pcVar11 = (pp->ftpc).pp.cache;
              }
              (*Curl_cfree)(pcVar11);
              (pp->ftpc).pp.cache = (char *)0x0;
              (conn->proto).ftpc.pp.cache_size = 0;
            }
          }
        }
LAB_0057c237:
        CVar8 = CVar6;
        (conn->proto).imapc.state = IMAP_STOP;
      }
      if (CVar8 != CURLE_OK) {
        return CVar8;
      }
LAB_0057c2af:
      if ((conn->proto).imapc.state == IMAP_STOP) {
        return CURLE_OK;
      }
LAB_0057c38d:
      _Var5 = Curl_pp_moredata(&(pp->ftpc).pp);
      CVar6 = CURLE_OK;
    } while (_Var5);
  }
  return CVar6;
}

Assistant:

static CURLcode pop3_statemach_act(struct connectdata *conn)
{
  CURLcode result = CURLE_OK;
  curl_socket_t sock = conn->sock[FIRSTSOCKET];
  int pop3code;
  struct pop3_conn *pop3c = &conn->proto.pop3c;
  struct pingpong *pp = &pop3c->pp;
  size_t nread = 0;

  /* Busy upgrading the connection; right now all I/O is SSL/TLS, not POP3 */
  if(pop3c->state == POP3_UPGRADETLS)
    return pop3_perform_upgrade_tls(conn);

  /* Flush any data that needs to be sent */
  if(pp->sendleft)
    return Curl_pp_flushsend(pp);

 do {
    /* Read the response from the server */
    result = Curl_pp_readresp(sock, pp, &pop3code, &nread);
    if(result)
      return result;

    if(!pop3code)
      break;

    /* We have now received a full POP3 server response */
    switch(pop3c->state) {
    case POP3_SERVERGREET:
      result = pop3_state_servergreet_resp(conn, pop3code, pop3c->state);
      break;

    case POP3_CAPA:
      result = pop3_state_capa_resp(conn, pop3code, pop3c->state);
      break;

    case POP3_STARTTLS:
      result = pop3_state_starttls_resp(conn, pop3code, pop3c->state);
      break;

    case POP3_AUTH:
      result = pop3_state_auth_resp(conn, pop3code, pop3c->state);
      break;

#ifndef CURL_DISABLE_CRYPTO_AUTH
    case POP3_APOP:
      result = pop3_state_apop_resp(conn, pop3code, pop3c->state);
      break;
#endif

    case POP3_USER:
      result = pop3_state_user_resp(conn, pop3code, pop3c->state);
      break;

    case POP3_PASS:
      result = pop3_state_pass_resp(conn, pop3code, pop3c->state);
      break;

    case POP3_COMMAND:
      result = pop3_state_command_resp(conn, pop3code, pop3c->state);
      break;

    case POP3_QUIT:
      /* fallthrough, just stop! */
    default:
      /* internal error */
      state(conn, POP3_STOP);
      break;
    }
  } while(!result && pop3c->state != POP3_STOP && Curl_pp_moredata(pp));

  return result;
}